

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

size_t promptTextColumnLen(char *prompt,size_t plen)

{
  short *psVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t off;
  ulong uVar5;
  uint uVar6;
  char buf [4096];
  
  sVar2 = 0;
  uVar5 = 0;
  do {
    if (plen <= uVar5) {
      sVar2 = columnPos(buf,sVar2,sVar2);
      return sVar2;
    }
    psVar1 = (short *)(prompt + uVar5);
    if ((plen - uVar5 < 3) || (uVar3 = 2, *psVar1 != 0x5b1b)) {
LAB_0010ac5f:
      buf[sVar2] = (char)*psVar1;
      sVar2 = sVar2 + 1;
      uVar4 = 1;
    }
    else {
      do {
        if (plen - uVar5 == uVar3) goto LAB_0010ac5f;
        uVar4 = uVar3 + 1;
        uVar6 = *(byte *)((long)psVar1 + uVar3) - 0x41;
        uVar3 = uVar4;
      } while ((0x2c < uVar6) || ((0x1020000c06ffU >> ((ulong)uVar6 & 0x3f) & 1) == 0));
    }
    uVar5 = uVar5 + uVar4;
  } while( true );
}

Assistant:

static size_t promptTextColumnLen(const char *prompt, size_t plen) {
    char buf[LINENOISE_MAX_LINE];
    size_t buf_len = 0;
    size_t off = 0;
    while (off < plen) {
        size_t len;
        if (isAnsiEscape(prompt + off, plen - off, &len)) {
            off += len;
            continue;
        }
        buf[buf_len++] = prompt[off++];
    }
    return columnPos(buf,buf_len,buf_len);
}